

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valve.cpp
# Opt level: O0

void __thiscall Valve::findOpenHeadLoss(Valve *this,double q)

{
  double *pdVar1;
  double dVar2;
  double extraout_XMM0_Qa;
  double q_local;
  Valve *this_local;
  
  dVar2 = this->lossFactor;
  std::abs((int)this);
  (this->super_Link).hGrad = dVar2 * 2.0 * extraout_XMM0_Qa;
  pdVar1 = &(this->super_Link).hGrad;
  if (1e-06 < *pdVar1 || *pdVar1 == 1e-06) {
    (this->super_Link).hLoss = ((this->super_Link).hGrad * q) / 2.0;
  }
  else {
    (this->super_Link).hGrad = 1e-06;
    (this->super_Link).hLoss = (this->super_Link).hGrad * q;
  }
  return;
}

Assistant:

void Valve::findOpenHeadLoss(double q)
{
    hGrad = 2.0 * lossFactor * abs(q);
    if ( hGrad < MIN_GRADIENT )
    {
        hGrad = MIN_GRADIENT;
        hLoss = hGrad * q;
    }
    else hLoss = hGrad * q / 2.0;
}